

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O0

void __thiscall CTcHashEntryPpDefine::parse_expansion(CTcHashEntryPpDefine *this,size_t *argvlen)

{
  wchar_t wVar1;
  int iVar2;
  int iVar3;
  CTcTokString *this_00;
  CVmHashEntry *this_01;
  ulong uVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  CVmHashTable *pCVar5;
  undefined4 extraout_var_02;
  char *pcVar6;
  char *pcVar7;
  long in_RSI;
  long in_RDI;
  size_t new_len;
  char flag_byte;
  size_t repl_len;
  size_t arg_len;
  int i;
  CTcHashEntryPpArg *entry;
  CTcTokString *defbuf;
  size_t expan_len;
  tok_embed_ctx ec;
  char *start;
  CTcToken tok;
  tc_toktyp_t typ;
  size_t dstofs;
  utf8_ptr src;
  size_t in_stack_fffffffffffffe78;
  CVmHashTable *in_stack_fffffffffffffe80;
  undefined6 in_stack_fffffffffffffe88;
  char in_stack_fffffffffffffe8e;
  char in_stack_fffffffffffffe8f;
  char *in_stack_fffffffffffffe90;
  CVmHashTable *in_stack_fffffffffffffe98;
  char local_139;
  ulong local_138;
  long local_130;
  ulong local_110;
  int in_stack_ffffffffffffff54;
  tok_embed_ctx *in_stack_ffffffffffffff58;
  CTcToken *in_stack_ffffffffffffff60;
  utf8_ptr *in_stack_ffffffffffffff68;
  CVmHashTable *local_58;
  CTcToken local_50;
  tc_toktyp_t local_24;
  char *local_20;
  utf8_ptr local_18;
  long local_10;
  
  if (*(int *)(in_RDI + 0x40) == 0) {
    *(undefined8 *)(in_RDI + 0x48) = *(undefined8 *)(in_RDI + 0x58);
    *(undefined8 *)(in_RDI + 0x50) = *(undefined8 *)(in_RDI + 0x60);
  }
  else {
    local_10 = in_RSI;
    utf8_ptr::utf8_ptr(&local_18);
    CTcToken::CTcToken(&local_50);
    tok_embed_ctx::tok_embed_ctx((tok_embed_ctx *)0x29c555);
    local_110 = *(ulong *)(in_RDI + 0x60);
    this_00 = &G_tok->defbuf_;
    (*this_00->_vptr_CTcTokString[2])(this_00,local_110);
    local_58 = *(CVmHashTable **)(in_RDI + 0x58);
    local_20 = (char *)0x0;
    utf8_ptr::set(&local_18,*(char **)(in_RDI + 0x58));
    while (local_24 = CTcTokenizer::next_on_line
                                (in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
                                 in_stack_ffffffffffffff58,in_stack_ffffffffffffff54),
          local_24 != TOKT_EOF) {
      if (local_24 == TOKT_SYM) {
        CTcToken::get_text(&local_50);
        CTcToken::get_text_len(&local_50);
        this_01 = CVmHashTable::find(in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,
                                     CONCAT17(in_stack_fffffffffffffe8f,
                                              CONCAT16(in_stack_fffffffffffffe8e,
                                                       in_stack_fffffffffffffe88)));
        if (this_01 != (CVmHashEntry *)0x0) {
          iVar3 = CTcHashEntryPpArg::get_argnum((CTcHashEntryPpArg *)this_01);
          local_130 = *(long *)(local_10 + (long)iVar3 * 8);
          local_138 = 2;
          local_139 = '\x01';
          if ((((*(byte *)(in_RDI + 0x44) >> 1 & 1) != 0) && (iVar3 == *(int *)(in_RDI + 0x40) + -1)
              ) && (wVar1 = utf8_ptr::getch((utf8_ptr *)0x29c6b9), wVar1 == L'#')) {
            pcVar6 = utf8_ptr::getptr(&local_18);
            iVar2 = memcmp(pcVar6 + 1,"foreach",7);
            if (iVar2 == 0) {
              utf8_ptr::getch_at((utf8_ptr *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
              iVar2 = is_sym(L'\0');
              if (iVar2 == 0) {
                local_130 = local_130 + 8;
                local_139 = '\x05';
                local_138 = 1;
                goto LAB_0029c86a;
              }
            }
            pcVar6 = utf8_ptr::getptr(&local_18);
            if (*(long *)(pcVar6 + 1) == 0x746e756f63677261) {
              utf8_ptr::getch_at((utf8_ptr *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
              iVar2 = is_sym(L'\0');
              if (iVar2 == 0) {
                local_130 = local_130 + 9;
                local_139 = '\x06';
                local_138 = 1;
                goto LAB_0029c86a;
              }
            }
            pcVar6 = utf8_ptr::getptr(&local_18);
            iVar2 = memcmp(pcVar6 + 1,"ifempty",7);
            if (iVar2 == 0) {
              utf8_ptr::getch_at((utf8_ptr *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
              iVar2 = is_sym(L'\0');
              if (iVar2 == 0) {
                local_130 = local_130 + 8;
                local_139 = '\a';
                local_138 = 1;
                goto LAB_0029c86a;
              }
            }
            pcVar6 = utf8_ptr::getptr(&local_18);
            if (*(long *)(pcVar6 + 1) == 0x7974706d656e6669) {
              utf8_ptr::getch_at((utf8_ptr *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
              iVar2 = is_sym(L'\0');
              if (iVar2 == 0) {
                local_130 = local_130 + 9;
                local_139 = '\b';
                local_138 = 1;
              }
            }
          }
LAB_0029c86a:
          uVar4 = (local_110 + local_138) - local_130;
          if (local_110 < uVar4) {
            (*this_00->_vptr_CTcTokString[2])(this_00,uVar4);
          }
          pCVar5 = (CVmHashTable *)CTcToken::get_text(&local_50);
          if (local_58 < pCVar5) {
            iVar2 = (*this_00->_vptr_CTcTokString[10])();
            in_stack_fffffffffffffe90 = local_20 + CONCAT44(extraout_var,iVar2);
            in_stack_fffffffffffffe98 = local_58;
            pcVar6 = CTcToken::get_text(&local_50);
            memcpy(in_stack_fffffffffffffe90,in_stack_fffffffffffffe98,(long)pcVar6 - (long)local_58
                  );
            pcVar6 = CTcToken::get_text(&local_50);
            local_20 = pcVar6 + ((long)local_20 - (long)local_58);
          }
          pcVar6 = CTcToken::get_text(&local_50);
          local_58 = (CVmHashTable *)(pcVar6 + local_130);
          iVar2 = (*this_00->_vptr_CTcTokString[10])();
          pcVar6 = local_20 + 1;
          local_20[CONCAT44(extraout_var_00,iVar2)] = local_139;
          in_stack_fffffffffffffe8f = local_139;
          local_110 = uVar4;
          local_20 = pcVar6;
          if (1 < local_138) {
            in_stack_fffffffffffffe8e = (char)iVar3 + '\x01';
            iVar3 = (*this_00->_vptr_CTcTokString[10])();
            local_20[CONCAT44(extraout_var_01,iVar3)] = in_stack_fffffffffffffe8e;
            in_stack_fffffffffffffe8f = local_139;
            local_20 = local_20 + 1;
          }
        }
      }
    }
    pCVar5 = (CVmHashTable *)CTcToken::get_text(&local_50);
    if (local_58 < pCVar5) {
      iVar3 = (*this_00->_vptr_CTcTokString[10])();
      pcVar6 = local_20 + CONCAT44(extraout_var_02,iVar3);
      in_stack_fffffffffffffe80 = local_58;
      pcVar7 = CTcToken::get_text(&local_50);
      memcpy(pcVar6,in_stack_fffffffffffffe80,(long)pcVar7 - (long)local_58);
    }
    (*this_00->_vptr_CTcTokString[0xb])(this_00,local_110);
    CTcTokString::get_text(this_00);
    pcVar6 = lib_copy_str((char *)in_stack_fffffffffffffe80);
    *(char **)(in_RDI + 0x48) = pcVar6;
    *(ulong *)(in_RDI + 0x50) = local_110;
  }
  return;
}

Assistant:

void CTcHashEntryPpDefine::parse_expansion(const size_t *argvlen)
{
    /*
     *   If there are arguments, scan the expansion for formal parameter
     *   names.  For each one we find, replace it with the special
     *   TOK_MACRO_FORMAL_FLAG character followed by a one-byte value giving
     *   the argument index.  This special sequence is less costly to find
     *   when we're expanding the macros - by doing the search here, we only
     *   need to do it once, rather than each time we expand the macro.  
     */
    if (argc_ != 0)
    {
        utf8_ptr src;
        size_t dstofs;
        tc_toktyp_t typ;
        CTcToken tok;
        const char *start;
        tok_embed_ctx ec;
        size_t expan_len = orig_expan_len_;

        /* 
         *   Generate our modified expansion text in the tokenizer's macro
         *   definition scratch buffer.  Initially, make sure we have room
         *   for a copy of the text; we'll resize the buffer later if we find
         *   we need even more.  
         */
        CTcTokString *defbuf = &G_tok->defbuf_;
        defbuf->ensure_space(expan_len);

        /* scan for argument names, and replace them */
        for (start = orig_expan_, dstofs = 0, src.set((char *)orig_expan_) ;; )
        {
            /* get the next token */
            typ = CTcTokenizer::next_on_line(&src, &tok, &ec, FALSE);

            /* if we've reached the end of the expansion, we're done */
            if (typ == TOKT_EOF)
                break;

            /* 
             *   If this is a formal parameter name, we'll replace it with a
             *   special two-byte sequence; otherwise, we'll keep it
             *   unchanged.  
             */
            if (typ == TOKT_SYM)
            {
                /* look up the symbol in our argument table */
                CTcHashEntryPpArg *entry =
                    (CTcHashEntryPpArg *)params_table_->find(
                        tok.get_text(), tok.get_text_len());

                /* check if we found it */
                if (entry != 0)
                {
                    /* get the argument number from the entry */
                    int i = entry->get_argnum();
                    
                    /* get the length of the formal name */
                    size_t arg_len = argvlen[i];

                    /* 
                     *   the normal replacement length for a formal parameter
                     *   is two bytes - one byte for the flag, and one for
                     *   the formal parameter index 
                     */
                    size_t repl_len = 2;

                    /* by default, the flag byte is the formal flag */
                    char flag_byte = TOK_MACRO_FORMAL_FLAG;

                    /*
                     *   Check for special varargs control suffixes.  If we
                     *   matched the last argument name, and this is a
                     *   varargs macro, we might have a suffix.  
                     */
                    if (has_varargs_
                        && i == argc_ - 1
                        && src.getch() == '#')
                    {
                        /* check for the various suffixes */
                        if (memcmp(src.getptr() + 1, "foreach", 7) == 0
                            && !is_sym(src.getch_at(8)))
                        {
                            /* 
                             *   include the suffix length in the token
                             *   length 
                             */
                            arg_len += 8;
                            
                            /* 
                             *   the flag byte is the #foreach flag, which is
                             *   a one-byte sequence 
                             */
                            flag_byte = TOK_MACRO_FOREACH_FLAG;
                            repl_len = 1;
                        }
                        else if (memcmp(src.getptr() + 1,
                                        "argcount", 8) == 0
                                 && !is_sym(src.getch_at(9)))
                        {
                            /* 
                             *   include the suffix length in the token
                             *   length 
                             */
                            arg_len += 9;
                            
                            /* 
                             *   the flag byte is the #argcount flag, which
                             *   is a one-byte sequence 
                             */
                            flag_byte = TOK_MACRO_ARGCOUNT_FLAG;
                            repl_len = 1;
                        }
                        else if (memcmp(src.getptr() + 1,
                                        "ifempty", 7) == 0
                                 && !is_sym(src.getch_at(8)))
                        {
                            /* include the length */
                            arg_len += 8;
                            
                            /* set the one-byte flag */
                            flag_byte = TOK_MACRO_IFEMPTY_FLAG;
                            repl_len = 1;
                        }
                        else if (memcmp(src.getptr() + 1,
                                        "ifnempty", 8) == 0
                                 && !is_sym(src.getch_at(9)))
                        {
                            /* include the length */
                            arg_len += 9;
                            
                            /* set the one-byte flag */
                            flag_byte = TOK_MACRO_IFNEMPTY_FLAG;
                            repl_len = 1;
                        }
                    }
                    
                    /* 
                     *   calculate the new length - we're removing the
                     *   argument name and adding the replacement string in
                     *   its place 
                     */
                    size_t new_len = expan_len + repl_len - arg_len;
                    
                    /* 
                     *   we need two bytes for the replacement - if this is
                     *   more than we're replacing, make sure we have room
                     *   for the extra 
                     */
                    if (new_len > expan_len)
                        defbuf->ensure_space(new_len);
                    
                    /* 
                     *   copy everything up to but not including the formal
                     *   name 
                     */
                    if (tok.get_text() > start)
                    {
                        /* store the text */
                        memcpy(defbuf->get_buf() + dstofs,
                               start, tok.get_text() - start);
                        
                        /* move past the stored text in the output */
                        dstofs += tok.get_text() - start;
                    }
                    
                    /* the next segment starts after this token */
                    start = tok.get_text() + arg_len;
                    
                    /* store the flag byte */
                    defbuf->get_buf()[dstofs++] = flag_byte;
                    
                    /* 
                     *   If appropriate, store the argument index - this
                     *   always fits in one byte because our hard limit on
                     *   formal parameters is less than 128 per macro.  Note
                     *   that we add one to the index so that we never store
                     *   a zero byte, to avoid any potential confusion with a
                     *   null terminator byte.  
                     */
                    if (repl_len > 1)
                        defbuf->get_buf()[dstofs++] = (char)(i + 1);
                    
                    /* remember the new length */
                    expan_len = new_len;
                }
            }
        }

        /* copy the last segment */
        if (tok.get_text() > start)
            memcpy(defbuf->get_buf() + dstofs, start, tok.get_text() - start);

        /* set the new length */
        defbuf->set_text_len(expan_len);

        /* save the parsed expansion */
        expan_ = lib_copy_str(defbuf->get_text());
        expan_len_ = expan_len;
    }
    else
    {
        /* 
         *   There are no arguments, so there's no parsing we need to do.
         *   Just use the original as the parsed expansion.  
         */
        expan_ = orig_expan_;
        expan_len_ = orig_expan_len_;
    }
}